

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void select_statically(saucy *s,int *target,int *lmin,int *rmin)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = s->splitvar;
  iVar1 = (s->left).cfront[piVar2[s->lev]];
  *rmin = iVar1;
  *target = iVar1;
  *lmin = (s->left).unlab[piVar2[s->lev]];
  return;
}

Assistant:

static void
select_statically(struct saucy *s, int *target, int *lmin, int *rmin)
{
    int i;

    *target = *rmin = s->left.cfront[s->splitvar[s->lev]];
    *lmin = s->left.unlab[s->splitvar[s->lev]];
    /* try to map identically! */
    for (i = *rmin; i <= (*rmin + s->right.clen[*target]); i++)
        if (s->right.lab[*rmin] == s->left.lab[*lmin]) {
            *rmin = i;
            break;
        }
}